

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.h
# Opt level: O0

SymbolTable<int,_int> * __thiscall
data_structures::SymbolTable<int,_int>::set(SymbolTable<int,_int> *this,int *key,int *value)

{
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar1;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar2;
  SymbolTableElement<int,_int> local_40;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *local_30;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *node;
  int *value_local;
  int *key_local;
  SymbolTable<int,_int> *this_local;
  
  node = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)value;
  value_local = key;
  key_local = (int *)this;
  local_30 = LinkedList<data_structures::SymbolTableElement<int,_int>_>::begin(&this->_list);
  while( true ) {
    pLVar1 = local_30;
    pLVar2 = LinkedList<data_structures::SymbolTableElement<int,_int>_>::end(&this->_list);
    if (pLVar1 == pLVar2) {
      SymbolTableElement<int,_int>::SymbolTableElement(&local_40,value_local,(int *)node);
      LinkedList<data_structures::SymbolTableElement<int,_int>_>::insertToTail
                (&this->_list,&local_40);
      SymbolTableElement<int,_int>::~SymbolTableElement(&local_40);
      return this;
    }
    if ((local_30->element).key == *value_local) break;
    local_30 = ListNode<data_structures::SymbolTableElement<int,_int>_>::next(local_30);
  }
  (local_30->element).value = *(int *)&node->_vptr_ListNode;
  return this;
}

Assistant:

inline
    SymbolTable<Key, Value>& SymbolTable<Key, Value>::set(const Key &key, const Value &value){
        for (auto node = _list.begin(); node != _list.end(); node = node->next()) {
            if (node->element.key == key) {
                node->element.value = value;
                return *this;
            }
        }
        _list.insertToTail(SymbolTableElement<Key, Value>(key, value));
        return *this;
    }